

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_util.c
# Opt level: O1

int kvtree_util_get_int64(kvtree *hash,char *key,int64_t *val)

{
  char *__nptr;
  longlong lVar1;
  
  __nptr = kvtree_get_val(hash,key);
  if (__nptr != (char *)0x0) {
    lVar1 = strtoll(__nptr,(char **)0x0,0);
    *val = lVar1;
  }
  return (uint)(__nptr == (char *)0x0);
}

Assistant:

int kvtree_util_get_int64(const kvtree* hash, const char* key, int64_t* val)
{
  int rc = KVTREE_FAILURE;

  /* check whether this key is even set */
  char* val_str = kvtree_get_val(hash, key);
  if (val_str != NULL) {
    /* convert the key string */
    *val = (int64_t) strtoll(val_str, NULL, 0);
    rc = KVTREE_SUCCESS;
  }

  return rc;
}